

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SAMCoupe.cpp
# Opt level: O1

bool SetDiskInfo(uint8_t pb_,MGT_DISK_INFO *di)

{
  SamDosType SVar1;
  long *plVar2;
  long *plVar3;
  bool bVar4;
  undefined7 in_register_00000039;
  ulong uVar5;
  string strPaddedLabel;
  long *local_60 [2];
  long local_50 [2];
  long *local_40;
  long local_38;
  long local_30;
  long lStack_28;
  
  uVar5 = CONCAT71(in_register_00000039,pb_) & 0xffffffff;
  SVar1 = di->dos_type;
  bVar4 = false;
  if (SVar1 == SAMDOS) {
    if ((di->disk_label)._M_string_length == 0) {
      return false;
    }
    if (opt.fix == 0) {
      return false;
    }
    if (opt.nosig != 0) {
      return false;
    }
    *(undefined4 *)(uVar5 + 0xe8) = 0x534f4442;
    di->dos_type = BDOS;
    bVar4 = true;
  }
  else if (SVar1 != BDOS) {
    if (SVar1 != MasterDOS) {
      return false;
    }
    *(undefined1 *)(uVar5 + 0xfc) = *(undefined1 *)((long)&di->serial_number + 1);
    *(char *)(uVar5 + 0xfd) = (char)di->serial_number;
    if ((di->disk_label)._M_string_length == 0) {
      *(undefined1 *)(uVar5 + 0xd2) = 0x2a;
      *(undefined8 *)(uVar5 + 0xd3) = 0x2020202020202020;
      *(undefined1 *)(uVar5 + 0xdb) = 0x20;
    }
    else {
      local_60[0] = local_50;
      std::__cxx11::string::_M_construct((ulong)local_60,'\n');
      plVar2 = (long *)std::__cxx11::string::replace
                                 ((ulong)local_60,0,(char *)0x0,
                                  (ulong)(di->disk_label)._M_dataplus._M_p);
      plVar3 = plVar2 + 2;
      if ((long *)*plVar2 == plVar3) {
        local_30 = *plVar3;
        lStack_28 = plVar2[3];
        local_40 = &local_30;
      }
      else {
        local_30 = *plVar3;
        local_40 = (long *)*plVar2;
      }
      local_38 = plVar2[1];
      *plVar2 = (long)plVar3;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      if (local_60[0] != local_50) {
        operator_delete(local_60[0],local_50[0] + 1);
      }
      *(short *)(uVar5 + 0xda) = (short)local_40[1];
      *(long *)(uVar5 + 0xd2) = *local_40;
      if (local_40 != &local_30) {
        operator_delete(local_40,local_30 + 1);
      }
    }
    return false;
  }
  local_60[0] = local_50;
  std::__cxx11::string::_M_construct((ulong)local_60,'\x10');
  plVar2 = (long *)std::__cxx11::string::replace
                             ((ulong)local_60,0,(char *)0x0,(ulong)(di->disk_label)._M_dataplus._M_p
                             );
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_30 = *plVar3;
    lStack_28 = plVar2[3];
    local_40 = &local_30;
  }
  else {
    local_30 = *plVar3;
    local_40 = (long *)*plVar2;
  }
  local_38 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  if (local_60[0] != local_50) {
    operator_delete(local_60[0],local_50[0] + 1);
  }
  *(short *)(uVar5 + 0xda) = (short)local_40[1];
  *(long *)(uVar5 + 0xd2) = *local_40;
  *(undefined2 *)(uVar5 + 0xfe) = *(undefined2 *)((long)local_40 + 0xe);
  *(undefined4 *)(uVar5 + 0xfa) = *(undefined4 *)((long)local_40 + 10);
  if (local_40 != &local_30) {
    operator_delete(local_40,local_30 + 1);
  }
  return bVar4;
}

Assistant:

bool SetDiskInfo(uint8_t pb_, MGT_DISK_INFO& di)
{
    auto p = reinterpret_cast<MGT_DIR*>(pb_);
    auto modified = false;

    // Extract the remaining disk information from type-specific locations
    switch (di.dos_type)
    {
    case SamDosType::MasterDOS:
        // Set serial number
        p->extra.abSerial[0] = static_cast<uint8_t>(di.serial_number >> 8);
        p->extra.abSerial[1] = static_cast<uint8_t>(di.serial_number);

        // No label?
        if (di.disk_label.empty())
        {
            p->abLabel[0] = '*';
            memset(p->abLabel + 1, ' ', sizeof(p->abLabel) - 1);
        }
        else
        {
            std::string strPaddedLabel = di.disk_label + std::string(sizeof(p->abLabel), ' ');
            memcpy(p->abLabel, strPaddedLabel.data(), sizeof(p->abLabel));
        }
        break;

    case SamDosType::SAMDOS:
        // Leave as SAMDOS format if there's no label, or we're not allowed to write a BDOS signature
        if (di.disk_label.empty() || opt.fix == 0 || opt.nosig)
            break;

        // Convert to BDOS format
        memcpy(p->abBDOS, "BDOS", 4);
        di.dos_type = SamDosType::BDOS;
        modified = true;

        // fall through...

    case SamDosType::BDOS:
    {
        // Form space-padded version of the label
        std::string strPaddedLabel = di.disk_label + std::string(BDOS_LABEL_SIZE, ' ');

        // Split across the two locations used
        memcpy(p->abLabel, strPaddedLabel.data(), sizeof(p->abLabel));
        memcpy(&p->extra.bDirTag, strPaddedLabel.data() + sizeof(p->abLabel), 6);   // last 6 characters
        break;
    }
    }

    return modified;
}